

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O2

int mraa_uart_lookup(char *uart_name)

{
  char *__s;
  mraa_board_t *pmVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  pmVar1 = plat;
  if ((uart_name != (char *)0x0 && plat != (mraa_board_t *)0x0) && (*uart_name != '\0')) {
    uVar5 = 0;
    uVar3 = (ulong)(uint)plat->uart_dev_count;
    if (plat->uart_dev_count < 1) {
      uVar3 = uVar5;
    }
    for (; uVar3 * 0x28 - uVar5 != 0; uVar5 = uVar5 + 0x28) {
      __s = *(char **)((long)&pmVar1->uart_dev[0].name + uVar5);
      if (__s != (char *)0x0) {
        sVar4 = strlen(__s);
        iVar2 = strncmp(uart_name,__s,sVar4 + 1);
        if (iVar2 == 0) {
          return *(int *)((long)&pmVar1->uart_dev[0].index + uVar5);
        }
      }
    }
  }
  return -1;
}

Assistant:

int
mraa_uart_lookup(const char* uart_name)
{
    int i;

    if (plat == NULL) {
        return -1;
    }

    if (uart_name == NULL || strlen(uart_name) == 0) {
        return -1;
    }

    for (i = 0; i < plat->uart_dev_count; i++) {
        if (plat->uart_dev[i].name != NULL &&
            strncmp(uart_name, plat->uart_dev[i].name, strlen(plat->uart_dev[i].name) + 1) == 0) {
            return plat->uart_dev[i].index;
        }
    }
    return -1;
}